

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

int lyd_insert_common(lyd_node *parent,lyd_node **sibling,lyd_node *node,int invalidate)

{
  lyd_node **pplVar1;
  uint uVar2;
  long lVar3;
  lyd_node *plVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  lys_node *plVar9;
  lys_node *plVar10;
  LY_ERR *pLVar11;
  ly_set *set;
  lyd_node *plVar12;
  lys_module *module;
  lys_node *plVar13;
  lyd_node **pplVar14;
  lyd_node *plVar15;
  int iVar16;
  lyd_node *plVar17;
  lyd_node *plVar18;
  LYS_NODE LVar19;
  int local_44;
  lyd_node *local_40;
  char local_31;
  
  if (parent == (lyd_node *)0x0 && sibling == (lyd_node **)0x0) {
    __assert_fail("parent || sibling",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0xd9a,
                  "int lyd_insert_common(struct lyd_node *, struct lyd_node **, struct lyd_node *, int)"
                 );
  }
  if (parent == (lyd_node *)0x0) {
    plVar17 = *sibling;
    do {
      local_40 = plVar17;
      plVar17 = local_40->prev;
    } while (local_40->prev->next != (lyd_node *)0x0);
  }
  else {
    local_40 = parent->child;
    plVar9 = parent->schema;
    if (local_40 == (lyd_node *)0x0) {
      LVar19 = LYS_ACTION|LYS_RPC|LYS_NOTIF|LYS_LIST|LYS_CONTAINER;
      if ((plVar9->nodetype & (LYS_ACTION|LYS_RPC)) == LYS_UNKNOWN) {
        LVar19 = LYS_OUTPUT|LYS_INPUT|LYS_NOTIF|LYS_LIST|LYS_CONTAINER;
      }
      goto LAB_0015a15d;
    }
    LVar19 = LYS_ACTION|LYS_RPC|LYS_NOTIF|LYS_LIST|LYS_CONTAINER;
    if ((plVar9->nodetype & (LYS_ACTION|LYS_RPC)) != LYS_UNKNOWN) goto LAB_0015a15d;
  }
  plVar9 = lys_parent(local_40->schema);
  LVar19 = LYS_OUTPUT|LYS_INPUT|LYS_NOTIF|LYS_LIST|LYS_CONTAINER;
  for (; plVar9 != (lys_node *)0x0; plVar9 = lys_parent(plVar9)) {
    if ((plVar9->nodetype & (LYS_OUTPUT|LYS_INPUT|LYS_NOTIF|LYS_LIST|LYS_CONTAINER)) != LYS_UNKNOWN)
    goto LAB_0015a15d;
  }
  plVar9 = (lys_node *)0x0;
LAB_0015a15d:
  plVar10 = node->schema;
  do {
    plVar10 = lys_parent(plVar10);
    if (plVar10 == (lys_node *)0x0) break;
  } while ((plVar10->nodetype & LVar19) == LYS_UNKNOWN);
  if (plVar9 != plVar10) {
    pLVar11 = ly_errno_location();
    *pLVar11 = LY_EINVAL;
    return 1;
  }
  local_31 = '\x01';
  local_44 = 0;
  if ((invalidate != 0) &&
     ((iVar7 = lyp_is_rpc_action(node->schema), parent == (lyd_node *)0x0 ||
      (iVar7 != 0 || node->parent != parent)))) {
    local_44 = iVar7 + 1;
    local_31 = iVar7 == 0;
  }
  if ((node->parent != (lyd_node *)0x0) || (node->prev->next != (lyd_node *)0x0)) {
    lyd_unlink_internal(node,local_44);
  }
  set = ly_set_new();
  pplVar1 = &parent->child;
  bVar5 = false;
LAB_0015a20d:
  plVar17 = node;
  if (plVar17 == (lyd_node *)0x0) {
    ly_set_free(set);
    if (bVar5) {
      for (; (parent != (lyd_node *)0x0 && ((parent->field_0x9 & 1) != 0)); parent = parent->parent)
      {
        parent->field_0x9 = parent->field_0x9 & 0xfe;
      }
    }
    if (sibling == (lyd_node **)0x0) {
      return 0;
    }
    *sibling = local_40;
    return 0;
  }
  node = plVar17->next;
  if ((local_44 == 1) &&
     (iVar7 = lyv_multicases(plVar17,(lys_node *)0x0,&local_40,1,(lyd_node *)0x0), iVar7 != 0)) {
    ly_set_free(set);
    return 1;
  }
  plVar17->next = (lyd_node *)0x0;
  bVar6 = plVar17->field_0x9 & 1;
  if (bVar6 == 0) {
    bVar5 = true;
  }
  plVar17->prev = plVar17;
  if ((((parent == (lyd_node *)0x0) || (bVar6 != 0)) ||
      (((lys_node_list *)parent->schema)->nodetype != LYS_LIST)) ||
     ((((lys_node_leaf *)plVar17->schema)->nodetype != LYS_LEAF ||
      (iVar7 = lys_is_key((lys_node_list *)parent->schema,(lys_node_leaf *)plVar17->schema),
      iVar7 == 0)))) {
    plVar9 = plVar17->schema;
    LVar19 = plVar9->nodetype;
    if (LVar19 == LYS_CONTAINER) {
      lVar3._0_2_ = plVar9[1].flags;
      lVar3._2_1_ = plVar9[1].ext_size;
      lVar3._3_1_ = plVar9[1].iffeature_size;
      lVar3._4_1_ = plVar9[1].padding[0];
      lVar3._5_1_ = plVar9[1].padding[1];
      lVar3._6_1_ = plVar9[1].padding[2];
      lVar3._7_1_ = plVar9[1].padding[3];
      if (lVar3 == 0) goto LAB_0015a369;
    }
    else {
      if (LVar19 == LYS_LEAF) {
LAB_0015a369:
        pplVar14 = &local_40;
LAB_0015a36d:
        plVar18 = *pplVar14;
        if (plVar18 != (lyd_node *)0x0) {
          if (plVar18->schema != plVar9) goto code_r0x0015a37e;
          if (((plVar17->field_0x9 & 1) != 0) || ((plVar18->field_0x9 & 1) != 0)) {
            plVar12 = plVar17;
            if ((plVar17->parent == (lyd_node *)0x0) && (plVar17->prev->next == (lyd_node *)0x0)) {
              while (plVar12->next != (lyd_node *)0x0) {
                plVar12->parent = plVar18->parent;
                plVar12 = plVar12->next;
              }
            }
            else {
              plVar17->next = (lyd_node *)0x0;
              plVar17->prev = plVar17;
            }
            plVar4 = plVar18->parent;
            if (plVar4 != (lyd_node *)0x0) {
              if (plVar4->child == plVar18) {
                plVar4->child = plVar17;
              }
              plVar18->parent = (lyd_node *)0x0;
            }
            plVar4 = plVar18->prev;
            if (plVar4 != plVar18) {
              if (plVar4->next != (lyd_node *)0x0) {
                plVar4->next = plVar17;
              }
              plVar17->prev = plVar4;
              plVar18->prev = plVar18;
              plVar4 = plVar18->next;
              if (plVar4 == (lyd_node *)0x0) {
                plVar4 = plVar17;
                if (plVar17->parent == (lyd_node *)0x0) {
                  do {
                    plVar15 = plVar4;
                    plVar4 = plVar15->prev;
                  } while (plVar4 != plVar18);
                  plVar15->prev = plVar12;
                }
                else {
                  plVar17->parent->child->prev = plVar12;
                }
              }
              else {
                plVar4->prev = plVar12;
                plVar12->next = plVar4;
                plVar18->next = (lyd_node *)0x0;
              }
            }
            lyd_free(plVar18);
            goto LAB_0015a5d2;
          }
        }
        goto LAB_0015a47c;
      }
      if ((LVar19 == LYS_LEAFLIST) &&
         ((uVar2 = set->number, uVar8 = ly_set_add(set,plVar9,0), plVar18 = local_40, uVar8 != uVar2
          || ((plVar17->field_0x9 & 1) != 0)))) {
LAB_0015a2fd:
        plVar12 = plVar18;
        if (plVar12 != (lyd_node *)0x0) {
          plVar18 = plVar12->next;
          if (plVar12->schema == plVar17->schema) {
            if ((plVar17->field_0x9 & 1) == 0) {
              if ((plVar12->field_0x9 & 1) == 0) goto LAB_0015a2fd;
            }
            else if (((plVar12->field_0x9 & 1) != 0) &&
                    (((plVar12->schema->flags & 1) == 0 ||
                     (iVar7 = strcmp((char *)plVar12->child,(char *)plVar17->child), iVar7 != 0))))
            goto LAB_0015a2fd;
            if (plVar12 == local_40) {
              local_40 = plVar18;
            }
            lyd_free(plVar12);
          }
          goto LAB_0015a2fd;
        }
      }
    }
LAB_0015a47c:
    if (local_40 == (lyd_node *)0x0) {
      local_40 = plVar17;
      if (parent != (lyd_node *)0x0) {
        *pplVar1 = plVar17;
      }
    }
    else if (local_31 == '\0') {
      for (plVar9 = plVar17->schema->parent;
          (plVar9->nodetype & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN; plVar9 = lys_parent(plVar9)) {
      }
      plVar10 = (lys_node *)0x0;
      pplVar14 = &local_40;
      while (plVar18 = *pplVar14, plVar18 != (lyd_node *)0x0) {
        while( true ) {
          module = lys_node_module(plVar9);
          plVar10 = lys_getnext(plVar10,plVar9,module,0);
          if (plVar10 == (lys_node *)0x0) break;
          plVar13 = plVar17->schema;
          if ((plVar18->schema == plVar10) || (plVar13 == plVar10)) goto LAB_0015a51e;
        }
        plVar13 = plVar17->schema;
LAB_0015a51e:
        if (plVar13 == plVar10) {
          if (((plVar10->nodetype & (LYS_LIST|LYS_LEAFLIST)) == LYS_UNKNOWN) ||
             (plVar18->schema != plVar13)) goto LAB_0015a54f;
          goto LAB_0015a540;
        }
        pplVar14 = &plVar18->next;
      }
LAB_0015a55f:
      plVar18 = local_40->prev;
      plVar18->next = plVar17;
      plVar17->prev = plVar18;
      local_40->prev = plVar17;
    }
    else {
      plVar18 = local_40->prev;
      plVar18->next = plVar17;
      plVar17->prev = plVar18;
      local_40->prev = plVar17;
    }
  }
  else {
    pplVar14 = pplVar1;
    for (iVar16 = 0; (plVar18 = *pplVar14, plVar18 != (lyd_node *)0x0 && (iVar16 < iVar7 + -1));
        iVar16 = iVar16 + 1) {
      if (plVar18->schema->nodetype != LYS_LEAF) goto LAB_0015a432;
      pplVar14 = &plVar18->next;
    }
    if (plVar18 == (lyd_node *)0x0) goto LAB_0015a47c;
LAB_0015a432:
    plVar12 = *pplVar1;
    if (*pplVar1 == plVar18) {
      *pplVar1 = plVar17;
      plVar12 = plVar17;
    }
    plVar4 = plVar18->prev;
    if (plVar4->next != (lyd_node *)0x0) {
      plVar4->next = plVar17;
    }
    plVar17->prev = plVar4;
    plVar18->prev = plVar17;
    plVar17->next = plVar18;
    if (plVar12 != local_40) {
      local_40 = plVar12;
    }
  }
  goto LAB_0015a5d2;
code_r0x0015a37e:
  pplVar14 = &plVar18->next;
  goto LAB_0015a36d;
LAB_0015a540:
  if (plVar18 == (lyd_node *)0x0) goto LAB_0015a55f;
  if (plVar18->schema != plVar13) goto LAB_0015a54f;
  plVar18 = plVar18->next;
  goto LAB_0015a540;
LAB_0015a54f:
  if (plVar18 == local_40) {
    local_40 = plVar17;
    pplVar14 = pplVar1;
    if (parent == (lyd_node *)0x0) goto LAB_0015a58e;
  }
  else {
    pplVar14 = &plVar18->prev->next;
  }
  *pplVar14 = plVar17;
LAB_0015a58e:
  plVar17->prev = plVar18->prev;
  plVar18->prev = plVar17;
  plVar17->next = plVar18;
LAB_0015a5d2:
  plVar17->parent = parent;
  if (invalidate != 0) {
    check_leaf_list_backlinks(plVar17,0);
  }
  if (local_44 != 0) {
    lyd_insert_setinvalid(plVar17);
  }
  goto LAB_0015a20d;
}

Assistant:

int
lyd_insert_common(struct lyd_node *parent, struct lyd_node **sibling, struct lyd_node *node, int invalidate)
{
    struct lys_node *par1, *par2;
    const struct lys_node *siter;
    struct lyd_node *start, *iter, *ins, *next1, *next2;
    int invalid = 0, isrpc = 0, clrdflt = 0;
    struct ly_set *llists = NULL;
    int pos, i;
    int stype = LYS_INPUT | LYS_OUTPUT;

    assert(parent || sibling);

    /* get first sibling */
    if (parent) {
        start = parent->child;
    } else {
        for (start = *sibling; start->prev->next; start = start->prev);
    }

    /* check placing the node to the appropriate place according to the schema */
    if (!start) {
        if (!parent) {
            /* empty tree to insert */
            if (node->parent || node->prev->next) {
                /* unlink the node first */
                lyd_unlink_internal(node, 1);
            } /* else insert also node's siblings */
            *sibling = node;
            return EXIT_SUCCESS;
        }
        par1 = parent->schema;
        if (par1->nodetype & (LYS_RPC | LYS_ACTION)) {
            /* it is not clear if the tree being created is going to
             * be rpc (LYS_INPUT) or rpc-reply (LYS_OUTPUT) so we have to
             * compare against LYS_RPC or LYS_ACTION in par2
             */
            stype = LYS_RPC | LYS_ACTION;
        }
    } else if (parent && (parent->schema->nodetype & (LYS_RPC | LYS_ACTION))) {
        par1 = parent->schema;
        stype = LYS_RPC | LYS_ACTION;
    } else {
        for (par1 = lys_parent(start->schema);
             par1 && !(par1->nodetype & (LYS_CONTAINER | LYS_LIST | LYS_INPUT | LYS_OUTPUT | LYS_NOTIF));
             par1 = lys_parent(par1));
    }
    for (par2 = lys_parent(node->schema);
         par2 && !(par2->nodetype & (LYS_CONTAINER | LYS_LIST | stype | LYS_NOTIF));
         par2 = lys_parent(par2));
    if (par1 != par2) {
        ly_errno = LY_EINVAL;
        return EXIT_FAILURE;
    }

    if (invalidate) {
        invalid = isrpc = lyp_is_rpc_action(node->schema);
        if (!parent || node->parent != parent || isrpc) {
            /* it is not just moving under a parent node or it is in an RPC where
             * nodes order matters, so the validation will be necessary */
            invalid++;
        }
    }

    /* unlink only if it is not a list of siblings without a parent and node is not the first sibling */
    if (node->parent || node->prev->next) {
        /* do it permanent if the parents are not exact same or if it is top-level */
        lyd_unlink_internal(node, invalid);
    }

    llists = ly_set_new();

    /* process the nodes to insert one by one */
    LY_TREE_FOR_SAFE(node, next1, ins) {
        if (invalid == 1) {
            /* auto delete nodes from other cases, if any;
             * this is done only if node->parent != parent */
            if (lyv_multicases(ins, NULL, &start, 1, NULL)) {
                goto error;
            }
        }

        /* isolate the node to be handled separately */
        ins->prev = ins;
        ins->next = NULL;

        iter = NULL;
        if (!ins->dflt) {
            clrdflt = 1;
        }

        /* are we inserting list key? */
        if (!ins->dflt && parent && parent->schema->nodetype == LYS_LIST && ins->schema->nodetype == LYS_LEAF
                && (pos = lys_is_key((struct lys_node_list *)parent->schema, (struct lys_node_leaf *)ins->schema))) {
            /* yes, we have a key, get know its position */
            for (i = 0, iter = parent->child;
                    iter && i < (pos - 1) && iter->schema->nodetype == LYS_LEAF;
                    i++, iter = iter->next) ;
            if (iter) {
                /* insert list's key to the correct position - before the iter */
                if (parent->child == iter) {
                    parent->child = ins;
                }
                if (iter->prev->next) {
                    iter->prev->next = ins;
                }
                ins->prev = iter->prev;
                iter->prev = ins;
                ins->next = iter;

                /* update start element */
                if (parent->child != start) {
                    start = parent->child;
                }
            }

            /* try to find previously present default instance to replace */
        } else if (ins->schema->nodetype == LYS_LEAFLIST) {
            i = (int)llists->number;
            if ((ly_set_add(llists, ins->schema, 0) != i) || ins->dflt) {
                /* each leaf-list must be cleared only once (except when looking for exact same existing dflt nodes) */
                LY_TREE_FOR_SAFE(start, next2, iter) {
                    if (iter->schema == ins->schema) {
                        if ((ins->dflt && (!iter->dflt || ((iter->schema->flags & LYS_CONFIG_W) &&
                                                           !strcmp(((struct lyd_node_leaf_list *)iter)->value_str,
                                                                  ((struct lyd_node_leaf_list *)ins)->value_str))))
                                || (!ins->dflt && iter->dflt)) {
                            if (iter == start) {
                                start = next2;
                            }
                            lyd_free(iter);
                        }
                    }
                }
            }
        } else if (ins->schema->nodetype == LYS_LEAF || (ins->schema->nodetype == LYS_CONTAINER
                        && !((struct lys_node_container *)ins->schema)->presence)) {
            LY_TREE_FOR(start, iter) {
                if (iter->schema == ins->schema) {
                    if (ins->dflt || iter->dflt) {
                        /* replace existing (either explicit or default) node with the new (either explicit or default) node */
                        lyd_replace(iter, ins, 1);
                    } else {
                        /* keep both explicit nodes, let the caller solve it later */
                        iter = NULL;
                    }
                    break;
                }
            }
        }

        if (!iter) {
            if (!start) {
                /* add as the only child of the parent */
                start = ins;
                if (parent) {
                    parent->child = ins;
                }
            } else if (isrpc) {
                /* add to the specific position in rpc/rpc-reply/action */
                for (par1 = ins->schema->parent; !(par1->nodetype & (LYS_INPUT | LYS_OUTPUT)); par1 = lys_parent(par1));
                siter = NULL;
                LY_TREE_FOR(start, iter) {
                    while ((siter = lys_getnext(siter, par1, lys_node_module(par1), 0))) {
                        if (iter->schema == siter || ins->schema == siter) {
                            break;
                        }
                    }
                    if (ins->schema == siter) {
                        if ((siter->nodetype & (LYS_LEAFLIST | LYS_LIST)) && iter->schema == siter) {
                            /* we are inserting leaflist/list instance, but since there are already
                             * some instances of the same leaflist/list, we want to insert the new one
                             * as the last instance, so here we have to move on */
                            while (iter && iter->schema == siter) {
                                iter = iter->next;
                            }
                            if (!iter) {
                                break;
                            }
                        }
                        /* we have the correct place for new node (before the iter) */
                        if (iter == start) {
                            start = ins;
                            if (parent) {
                                parent->child = ins;
                            }
                        } else {
                            iter->prev->next = ins;
                        }
                        ins->prev = iter->prev;
                        iter->prev = ins;
                        ins->next = iter;

                        /* we are done */
                        break;
                    }
                }
                if (!iter) {
                    /* add as the last child of the parent */
                    start->prev->next = ins;
                    ins->prev = start->prev;
                    start->prev = ins;
                }
            } else {
                /* add as the last child of the parent */
                start->prev->next = ins;
                ins->prev = start->prev;
                start->prev = ins;
            }
        }
        ins->parent = parent;

        if (invalidate) {
            check_leaf_list_backlinks(ins, 0);
        }

        if (invalid) {
            lyd_insert_setinvalid(ins);
        }
    }
    ly_set_free(llists);

    if (clrdflt) {
        /* remove the dflt flag from parents */
        for (iter = parent; iter && iter->dflt; iter = iter->parent) {
            iter->dflt = 0;
        }
    }

    if (sibling) {
        *sibling = start;
    }
    return EXIT_SUCCESS;

error:
    ly_set_free(llists);
    return EXIT_FAILURE;
}